

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_AActor_A_LookEx(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  int iVar1;
  AActor *this;
  uint uVar2;
  int iVar3;
  MetaClass *pMVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  bool bVar7;
  TObjPtr *local_110;
  bool local_ff;
  TFlags<ActorFlag,_unsigned_int> local_fc;
  FSoundID local_f8;
  FSoundID local_f4;
  TFlags<ActorFlag,_unsigned_int> local_f0;
  TFlags<ActorFlag,_unsigned_int> local_ec;
  TFlags<ActorFlag4,_unsigned_int> local_e8;
  TFlags<ActorFlag,_unsigned_int> local_e4;
  TFlags<ActorFlag,_unsigned_int> local_e0;
  TFlags<ActorFlag,_unsigned_int> local_dc;
  Self local_d8;
  FName local_d4;
  undefined1 local_d0 [8];
  NActorIterator iterator;
  undefined1 local_b0 [8];
  FLookExParams params;
  double dist;
  AActor *targ;
  FState *seestate;
  DAngle fov;
  double maxheardist;
  double maxseedist;
  double minseedist;
  int flags;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x816,
                  "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar7 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar7 = true, (param->field_0).field_1.atag != 1)) {
    bVar7 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar7) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x816,
                  "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  local_ff = true;
  if (this != (AActor *)0x0) {
    local_ff = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_ff == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                  ,0x816,
                  "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (numparam < 2) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    if ((pVVar5->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x817,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
    minseedist._4_4_ = (pVVar5->field_0).i;
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x817,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    minseedist._4_4_ = param[1].field_0.i;
  }
  if (numparam < 3) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    if ((pVVar5->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x818,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
    maxseedist = (pVVar5->field_0).f;
  }
  else {
    if (param[2].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x818,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    maxseedist = param[2].field_0.f;
  }
  if (numparam < 4) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    if ((pVVar5->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x819,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
    maxheardist = (pVVar5->field_0).f;
  }
  else {
    if (param[3].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x819,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    maxheardist = param[3].field_0.f;
  }
  if (numparam < 5) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    if ((pVVar5->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81a,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
    fov.Degrees = (double)(pVVar5->field_0).field_1.a;
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81a,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    fov.Degrees = (double)param[4].field_0.field_1.a;
  }
  TAngle<double>::TAngle((TAngle<double> *)&seestate);
  if (numparam < 6) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    if ((pVVar5->field_0).field_3.Type != '\x01') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81b,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
    TAngle<double>::operator=((TAngle<double> *)&seestate,(pVVar5->field_0).f);
  }
  else {
    if (param[5].field_0.field_3.Type != '\x01') {
      __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81b,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    TAngle<double>::operator=((TAngle<double> *)&seestate,param[5].field_0.f);
  }
  if (numparam < 7) {
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    if ((pVVar5->field_0).field_3.Type != '\0') {
      __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81c,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pVVar5 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
    iVar1 = (pVVar5->field_0).i;
    pMVar4 = AActor::GetClass(this);
    targ = (AActor *)FStateLabelStorage::GetState(&StateLabels,iVar1,pMVar4,false);
  }
  else {
    if (param[6].field_0.field_3.Type != '\0') {
      __assert_fail("(param[paramnum]).Type == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                    ,0x81c,
                    "int AF_AActor_A_LookEx(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    iVar1 = param[6].field_0.i;
    pMVar4 = AActor::GetClass(this);
    targ = (AActor *)FStateLabelStorage::GetState(&StateLabels,iVar1,pMVar4,false);
  }
  dist = 0.0;
  bVar7 = TAngle<double>::operator==((TAngle<double> *)&seestate,0.0);
  if (bVar7) {
    TAngle<double>::operator=((TAngle<double> *)&seestate,180.0);
  }
  TAngle<double>::TAngle((TAngle<double> *)local_b0,(TAngle<double> *)&seestate);
  params.Fov.Degrees = maxseedist;
  params.minDist = maxheardist;
  params.maxDist = fov.Degrees;
  params.maxHeardist._0_4_ = minseedist._4_4_;
  params._32_8_ = targ;
  iVar1 = (int)this;
  TFlags<ActorFlag5,_unsigned_int>::operator&
            ((TFlags<ActorFlag5,_unsigned_int> *)((long)&iterator.type + 4),
             iVar1 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF))
  ;
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&iterator.type + 4));
  if (uVar2 != 0) {
    return 0;
  }
  if ((this->special == 0xe5) && (this->args[0] == 0)) {
    FName::FName(&local_d4,NAME_PatrolPoint);
    NActorIterator::NActorIterator((NActorIterator *)local_d0,&local_d4,this->args[1]);
    this->special = 0;
    pAVar6 = NActorIterator::Next((NActorIterator *)local_d0);
    TObjPtr<AActor>::operator=(&this->goal,pAVar6);
    this->reactiontime = this->args[2] * 0x23 + level.maptime;
    if (this->args[3] == 0) {
      operator~((EnumType)&local_d8);
      TFlags<ActorFlag5,_unsigned_int>::operator&=(&this->flags5,&local_d8);
    }
    else {
      TFlags<ActorFlag5,_unsigned_int>::operator|=(&this->flags5,MF5_CHASEGOAL);
    }
  }
  this->threshold = 0;
  if (this->TIDtoHate == 0) {
    if ((minseedist._4_4_ & 2) == 0) {
      if ((i_compatflags & 0x800U) == 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_dc,
                   iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                           MF_SHOOTABLE));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_dc);
        if (uVar2 != 0) goto LAB_00556925;
        local_110 = (TObjPtr *)&this->LastHeard;
      }
      else {
LAB_00556925:
        local_110 = (TObjPtr *)&this->Sector->SoundTarget;
      }
      dist = (double)TObjPtr::operator_cast_to_AActor_(local_110);
      if ((AActor *)dist != (AActor *)0x0) {
        if (((AActor *)dist)->health < 1) {
          dist = 0.0;
        }
        else {
          params.seestate = (FState *)AActor::Distance2D(this,(AActor *)dist,false);
          if (((fov.Degrees != 0.0) || (NAN(fov.Degrees))) &&
             (fov.Degrees < (double)params.seestate)) {
            dist = 0.0;
            TObjPtr<AActor>::operator=(&this->LastHeard,(AActor *)0x0);
          }
        }
      }
    }
    if (((dist != 0.0) && (*(long *)((long)dist + 0x230) != 0)) &&
       ((*(uint *)(*(long *)((long)dist + 0x230) + 0xe8) & 8) != 0)) {
      return 0;
    }
  }
  else {
    dist = (double)TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_e0,
             iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e0);
  if (uVar2 != 0) {
    this->visdir = -1;
  }
  bVar7 = false;
  if (dist != 0.0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_e4,
               SUB84(dist,0) +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
    bVar7 = uVar2 != 0;
  }
  if (bVar7) {
    bVar7 = AActor::IsFriend(this,(AActor *)dist);
    if (bVar7) {
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_e8,
                 iVar1 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
      uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e8);
      if (uVar2 == 0) {
        if (((minseedist._4_4_ & 1) == 0) &&
           (bVar7 = P_LookForPlayers(this,1,(FLookExParams *)local_b0), bVar7)) goto LAB_00556d20;
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_ec,
                   iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                           MF_SHOOTABLE));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_ec);
        if (uVar2 == 0) {
          if (targ == (AActor *)0x0) {
            if (this->SeeState == (FState *)0x0) {
              A_Wander(this,0);
            }
            else {
              AActor::SetState(this,this->SeeState,false);
            }
          }
          else {
            AActor::SetState(this,(FState *)targ,false);
          }
        }
      }
    }
    else {
      TObjPtr<AActor>::operator=(&this->target,(AActor *)dist);
      bVar7 = TObjPtr<AActor>::operator==(&this->target,this);
      if (bVar7) {
        TObjPtr<AActor>::operator=(&this->target,(AActor *)0x0);
      }
      bVar7 = TObjPtr<AActor>::operator!=(&this->target,(AActor *)0x0);
      if (bVar7) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_f0,
                   iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                           MF_SHOOTABLE));
        uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f0);
        if (uVar2 == 0) goto LAB_00556d20;
        pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
        params.seestate = (FState *)AActor::Distance2D(this,pAVar6,false);
        pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
        bVar7 = P_CheckSight(this,pAVar6,4);
        if (((bVar7) &&
            (((maxseedist == 0.0 && (!NAN(maxseedist))) || (maxseedist < (double)params.seestate))))
           && (((maxheardist == 0.0 && (!NAN(maxheardist))) ||
               ((double)params.seestate < maxheardist)))) goto LAB_00556d20;
      }
    }
  }
  if ((minseedist._4_4_ & 1) != 0) {
    return 0;
  }
  bVar7 = P_LookForPlayers(this,1,(FLookExParams *)local_b0);
  if (!bVar7) {
    return 0;
  }
LAB_00556d20:
  pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->goal);
  bVar7 = TObjPtr<AActor>::operator==(&this->target,pAVar6);
  if (bVar7) {
    if (level.maptime < this->reactiontime) {
      TObjPtr<AActor>::operator=(&this->target,(AActor *)0x0);
    }
  }
  else {
    iVar3 = FSoundID::operator_cast_to_int(&(this->SeeSound).super_FSoundID);
    if ((iVar3 != 0) && ((minseedist._4_4_ & 8) == 0)) {
      if ((minseedist._4_4_ & 0x10) == 0) {
        FSoundID::FSoundID(&local_f8,&(this->SeeSound).super_FSoundID);
        S_Sound(this,2,&local_f8,1.0,1.0);
      }
      else {
        FSoundID::FSoundID(&local_f4,&(this->SeeSound).super_FSoundID);
        S_Sound(this,2,&local_f4,1.0,0.0);
      }
    }
  }
  pAVar6 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
  bVar7 = false;
  if (pAVar6 != (AActor *)0x0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_fc,
               iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_fc);
    bVar7 = uVar2 == 0;
  }
  if ((bVar7) && ((minseedist._4_4_ & 0x20) == 0)) {
    if (targ == (AActor *)0x0) {
      AActor::SetState(this,this->SeeState,false);
    }
    else {
      AActor::SetState(this,(FState *)targ,false);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_LookEx)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(flags)			
	PARAM_FLOAT_DEF	(minseedist)	
	PARAM_FLOAT_DEF	(maxseedist)	
	PARAM_FLOAT_DEF (maxheardist)	
	PARAM_ANGLE_DEF (fov)			
	PARAM_STATE_DEF	(seestate)		

	AActor *targ = NULL; // Shuts up gcc
	double dist;
	if (fov == 0) fov = 180.;
	FLookExParams params = { fov, minseedist, maxseedist, maxheardist, flags, seestate };

	if (self->flags5 & MF5_INCONVERSATION)
		return 0;

	// [RH] Set goal now if appropriate
	if (self->special == Thing_SetGoal && self->args[0] == 0) 
	{
		NActorIterator iterator(NAME_PatrolPoint, self->args[1]);
		self->special = 0;
		self->goal = iterator.Next ();
		self->reactiontime = self->args[2] * TICRATE + level.maptime;
		if (self->args[3] == 0)
			self->flags5 &= ~MF5_CHASEGOAL;
		else
			self->flags5 |= MF5_CHASEGOAL;
	}

	self->threshold = 0;		// any shot will wake up

	if (self->TIDtoHate != 0)
	{
		targ = self->target;
	}
	else
	{
		if (!(flags & LOF_NOSOUNDCHECK))
		{
			targ = (i_compatflags & COMPATF_SOUNDTARGET || self->flags & MF_NOSECTOR)?
				self->Sector->SoundTarget : self->LastHeard;
			if (targ != NULL)
			{
				// [RH] If the soundtarget is dead, don't chase it
				if (targ->health <= 0)
				{
					targ = NULL;
				}
				else
				{
					dist = self->Distance2D (targ);

					// [KS] If the target is too far away, don't respond to the sound.
					if (maxheardist && dist > maxheardist)
					{
						targ = NULL;
						self->LastHeard = NULL;
					}
				}
			}
        }
        
        if (targ && targ->player && (targ->player->cheats & CF_NOTARGET))
        {
            return 0;
        }
	}

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->visdir = -1;
	}

	if (targ && (targ->flags & MF_SHOOTABLE))
	{
		if (self->IsFriend (targ))	// be a little more precise!
		{
			if (!(self->flags4 & MF4_STANDSTILL))
			{
				if (!(flags & LOF_NOSIGHTCHECK))
				{
					// If we find a valid target here, the wandering logic should *not*
					// be activated! If would cause the seestate to be set twice.
					if (P_LookForPlayers(self, true, &params))
						goto seeyou;
				}

				// Let the self wander around aimlessly looking for a fight
                if (!(self->flags & MF_INCHASE))
                {
                    if (seestate)
                    {
                        self->SetState (seestate);
                    }
                    else
                    {
                        if (self->SeeState != NULL)
                        {
                            self->SetState (self->SeeState);
                        }
                        else
                        {
                            A_Wander(self);
                        }
                    }
                }
			}
		}
		else
		{
			self->target = targ; //We already have a target?
            
            // [KS] The target can become ourselves in rare circumstances (like
            // if we committed suicide), so if that's the case, just ignore it.
            if (self->target == self) self->target = NULL;

			if (self->target != NULL)
			{
				if (self->flags & MF_AMBUSH)
				{
					dist = self->Distance2D (self->target);
					if (P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING) &&
						(!minseedist || dist > minseedist) &&
						(!maxseedist || dist < maxseedist))
					{
						goto seeyou;
					}
				}
				else
					goto seeyou;
			}
		}
	}

	if (!(flags & LOF_NOSIGHTCHECK))
	{
		if (!P_LookForPlayers(self, true, &params))
			return 0;
	}
	else
	{
		return 0;
	}
				
	// go into chase state
  seeyou:
	// [RH] Don't start chasing after a goal if it isn't time yet.
	if (self->target == self->goal)
	{
		if (self->reactiontime > level.maptime)
			self->target = NULL;
	}
	else if (self->SeeSound && !(flags & LOF_NOSEESOUND))
	{
		if (flags & LOF_FULLVOLSEESOUND)
		{ // full volume
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NONE);
		}
		else
		{
			S_Sound (self, CHAN_VOICE, self->SeeSound, 1, ATTN_NORM);
		}
	}

	if (self->target && !(self->flags & MF_INCHASE))
	{
        if (!(flags & LOF_NOJUMP))
        {
            if (seestate)
            {
                self->SetState (seestate);
            }
            else
            {
                self->SetState (self->SeeState);
            }
        }
	}
	return 0;
}